

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram.c
# Opt level: O2

CURLcode Curl_auth_decode_cram_md5_message(char *chlg64,char **outptr,size_t *outlen)

{
  char cVar1;
  char cVar2;
  uchar uVar3;
  CURLcode CVar4;
  size_t sVar5;
  uchar *puVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uchar *puVar13;
  size_t sVar14;
  
  cVar2 = *chlg64;
  *outptr = (char *)0x0;
  *outlen = 0;
  if ((cVar2 == '\0') || (*chlg64 == '=')) {
    return CURLE_OK;
  }
  *outptr = (char *)0x0;
  *outlen = 0;
  sVar5 = strlen(chlg64);
  CVar4 = CURLE_BAD_CONTENT_ENCODING;
  if ((sVar5 & 3) == 0 && sVar5 != 0) {
    for (lVar10 = 0; chlg64[lVar10] != '\0'; lVar10 = lVar10 + 1) {
      if (chlg64[lVar10] == '=') {
        lVar8 = (ulong)(chlg64[lVar10 + 1] == '=') + 1;
        goto LAB_0010cd6a;
      }
    }
    lVar8 = 0;
LAB_0010cd6a:
    if (sVar5 - lVar8 == lVar10) {
      sVar14 = (sVar5 >> 2) * 3 - lVar8;
      puVar6 = (uchar *)(*Curl_cmalloc)(sVar14 + 1);
      if (puVar6 == (uchar *)0x0) {
        CVar4 = CURLE_OUT_OF_MEMORY;
      }
      else {
        puVar13 = puVar6;
        for (uVar12 = 0; uVar12 != sVar5 >> 2; uVar12 = uVar12 + 1) {
          lVar8 = 0;
          uVar9 = 0;
          pcVar7 = chlg64;
          for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
            cVar2 = *pcVar7;
            if (cVar2 == '=') {
              uVar9 = uVar9 << 6;
              lVar8 = lVar8 + 1;
            }
            else {
              for (lVar11 = 0;
                  (cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                           [lVar11], cVar1 != '\0' && (cVar1 != cVar2)); lVar11 = lVar11 + 1) {
              }
              if (cVar1 != cVar2) goto LAB_0010ce67;
              uVar9 = uVar9 * 0x40 + lVar11;
            }
            pcVar7 = pcVar7 + 1;
          }
          if (lVar8 == 1) {
LAB_0010ce2f:
            uVar3 = curlx_ultouc(uVar9 >> 8 & 0xff);
            puVar13[1] = uVar3;
          }
          else if (lVar8 == 0) {
            uVar3 = curlx_ultouc(uVar9 & 0xff);
            puVar13[2] = uVar3;
            goto LAB_0010ce2f;
          }
          uVar3 = curlx_ultouc(uVar9 >> 0x10 & 0xff);
          *puVar13 = uVar3;
          if (lVar8 == 3) {
LAB_0010ce67:
            (*Curl_cfree)(puVar6);
            return CURLE_BAD_CONTENT_ENCODING;
          }
          puVar13 = puVar13 + (3 - lVar8);
          chlg64 = chlg64 + 4;
        }
        *puVar13 = '\0';
        *outptr = (char *)puVar6;
        *outlen = sVar14;
        CVar4 = CURLE_OK;
      }
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_auth_decode_cram_md5_message(const char *chlg64, char **outptr,
                                           size_t *outlen)
{
  CURLcode result = CURLE_OK;
  size_t chlg64len = strlen(chlg64);

  *outptr = NULL;
  *outlen = 0;

  /* Decode the challenge if necessary */
  if(chlg64len && *chlg64 != '=')
    result = Curl_base64_decode(chlg64, (unsigned char **) outptr, outlen);

  return result;
}